

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printState(microseconds time,Timeline *timeline,size_t numPeers,double quantum)

{
  UdpSender *this;
  long lVar1;
  ostream *poVar2;
  OutboundPacketStream *pOVar3;
  char *packet;
  size_t sVar4;
  int i;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  OutboundPacketStream p;
  char buffer [1024];
  BeginMessage local_468;
  OutboundPacketStream local_460;
  char local_428 [1024];
  
  dVar6 = ableton::Link::Timeline::beatAtTime(timeline,time,quantum);
  dVar7 = ableton::Link::Timeline::phaseAtTime(timeline,time,quantum);
  dVar8 = ((timeline->mTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
           super__Head_base<0UL,_double,_false>._M_head_impl / quantum) / 60.0;
  if (printState::diff == 0) {
    lVar1 = std::chrono::_V2::system_clock::now();
    printState::diff = ((lVar1 / 1000000) * 1000 - time.__r) + 500;
  }
  dVar9 = (double)(printState::diff + time.__r) / 1000000.0 + -0.2;
  dVar10 = floor(dVar9);
  dVar9 = floor((dVar9 - (double)(int)dVar10) * 1000000.0);
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb;
  poVar2 = std::operator<<((ostream *)&std::cout,"peers: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," | ");
  std::operator<<(poVar2,"quantum: ");
  poVar2 = std::ostream::_M_insert<double>(quantum);
  poVar2 = std::operator<<(poVar2," | ");
  std::operator<<(poVar2,"tempo: ");
  poVar2 = std::ostream::_M_insert<double>
                     ((timeline->mTimeline).tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>
                      .super__Head_base<0UL,_double,_false>._M_head_impl);
  poVar2 = std::operator<<(poVar2," | ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar2,"beats: ");
  poVar2 = std::ostream::_M_insert<double>(dVar6);
  poVar2 = std::operator<<(poVar2," | sec: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)dVar10);
  poVar2 = std::operator<<(poVar2," | usec: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)dVar9);
  std::operator<<(poVar2," | ");
  if ((dVar8 != printState::last_cps) || (NAN(dVar8) || NAN(printState::last_cps))) {
    osc::OutboundPacketStream::OutboundPacketStream(&local_460,local_428,0x400);
    std::operator<<((ostream *)&std::cout,"\nnew cps: ");
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar2," | last cps: ");
    poVar2 = std::ostream::_M_insert<double>(printState::last_cps);
    std::operator<<(poVar2,"\n");
    local_468.addressPattern = "/tempo";
    printState::last_cps = dVar8;
    pOVar3 = osc::OutboundPacketStream::operator<<(&local_460,&local_468);
    pOVar3 = osc::OutboundPacketStream::operator<<(pOVar3,(int)dVar10);
    pOVar3 = osc::OutboundPacketStream::operator<<(pOVar3,(int)dVar9);
    pOVar3 = osc::OutboundPacketStream::operator<<(pOVar3,(float)(dVar6 / quantum));
    pOVar3 = osc::OutboundPacketStream::operator<<(pOVar3,(float)dVar8);
    pOVar3 = osc::OutboundPacketStream::operator<<(pOVar3,"True");
    osc::OutboundPacketStream::operator<<(pOVar3,(MessageTerminator *)&osc::EndMessage);
    this = sender;
    packet = osc::OutboundPacketStream::Data(&local_460);
    sVar4 = osc::OutboundPacketStream::Size(&local_460);
    UdpSender::Send(this,packet,(int)sVar4);
    osc::OutboundPacketStream::~OutboundPacketStream(&local_460);
  }
  dVar6 = ceil(quantum);
  for (iVar5 = 0; (double)iVar5 < dVar6; iVar5 = iVar5 + 1) {
    std::operator<<((ostream *)&std::cout,((double)iVar5 < dVar7) * '\t' + 'O');
  }
  clearLine();
  return;
}

Assistant:

void printState(const std::chrono::microseconds time,
    const ableton::Link::Timeline timeline,
    const std::size_t numPeers,
    const double quantum)
{
  const auto beats = timeline.beatAtTime(time, quantum);
  const auto phase = timeline.phaseAtTime(time, quantum);
  const auto cycle = beats / quantum;
  const double cps = (timeline.tempo() / quantum) / 60;
  const auto t     = std::chrono::microseconds(time).count();
  static long diff = 0;
  static double last_cps = -1;
  //const auto time = state.link.clock().micros();
  
  if (diff == 0) {
    unsigned long milliseconds_since_epoch = 
      std::chrono::duration_cast<std::chrono::milliseconds>
      (std::chrono::system_clock::now().time_since_epoch()).count();
    // POSIX is millis and Link is micros.. Not sure if that `+500` helps
    diff = ((milliseconds_since_epoch*1000 + 500) - t);
  }
  double timetag_ut = ((double) (t + diff)) / ((double) 1000000);
  // latency hack
  timetag_ut -= 0.2;
  int sec = floor(timetag_ut);
  int usec = floor(1000000 * (timetag_ut - sec));

  std::cout << std::defaultfloat << "peers: " << numPeers << " | "
            << "quantum: " << quantum << " | "
            << "tempo: " << timeline.tempo() << " | " << std::fixed << "beats: " << beats
            << " | sec: " << sec
            << " | usec: " << usec
            << " | ";
  if (cps != last_cps) {
    //UdpBroadcastSocket s(IpEndpointName( "127.255.255.255", 6040));
    char buffer[OUTPUT_BUFFER_SIZE];
    osc::OutboundPacketStream p( buffer, OUTPUT_BUFFER_SIZE );
    std::cout << "\nnew cps: " << cps << " | last cps: " << last_cps << "\n";
    last_cps = cps;

    p << osc::BeginMessage( "/tempo" )
      << sec << usec
      << (float) cycle << (float) cps << "True" << osc::EndMessage;
    //s.Send( p.Data(), p.Size() );
    sender->Send((char *)p.Data(), p.Size());
  }
  for (int i = 0; i < ceil(quantum); ++i)
  {
    if (i < phase)
    {
      std::cout << 'X';
    }
    else
    {
      std::cout << 'O';
    }
  }
  clearLine();
}